

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkcell.c
# Opt level: O0

void * createcell68k(uint type)

{
  uint LAddr;
  LispPTR LVar1;
  DLword *pDVar2;
  LispPTR *base;
  ulong uVar3;
  ulong uVar4;
  LispPTR newcell;
  DLword *lastptr;
  DLword *ptr;
  dtd *dtd68k;
  uint type_local;
  
  pDVar2 = DTDspace;
  uVar3 = (ulong)(type << 4);
  uVar4 = (ulong)(type << 1);
  if (DTDspace[uVar3 + uVar4 + 2] == 0) {
    error("createcell : Attempt to create a cell not declared yet");
  }
  while (LAddr = *(uint *)(pDVar2 + uVar3 + uVar4 + 4) & 0xfffffff, LAddr == 0) {
    base = alloc_mdspage(pDVar2[uVar3 + uVar4 + 0x11]);
    LVar1 = initmdspage(base,pDVar2[uVar3 + uVar4 + 2],0);
    *(LispPTR *)(pDVar2 + uVar3 + uVar4 + 4) = LVar1;
    if ((*(uint *)(pDVar2 + uVar3 + uVar4 + 4) & 0x8000000) != 0) {
      error("bad entry on free chain.");
    }
  }
  lastptr = NativeAligned2FromLAddr(LAddr);
  if (*(uint *)lastptr == 0xe0001) {
    error("N_OP_createcell E0001 error");
  }
  *(uint *)(pDVar2 + uVar3 + uVar4 + 4) = *(uint *)lastptr & 0xfffffff;
  if ((*(uint *)(pDVar2 + uVar3 + uVar4 + 4) & 0x8000000) != 0) {
    error("bad entry on free chain.");
  }
  *(int *)(pDVar2 + uVar3 + uVar4 + 0xc) = *(int *)(pDVar2 + uVar3 + uVar4 + 0xc) + 1;
  pDVar2 = (DLword *)((long)lastptr + (long)(int)(uint)pDVar2[uVar3 + uVar4 + 2] * 2);
  for (; lastptr != pDVar2; lastptr = lastptr + 1) {
    *(undefined2 *)((ulong)lastptr ^ 2) = 0;
  }
  if (((*(ushort *)((ulong)(MDStypetbl + (LAddr >> 9)) ^ 2) & 0x8000) == 0) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(LAddr,1);
    }
    else {
      htfind(LAddr,1);
    }
  }
  pDVar2 = NativeAligned2FromLAddr(LAddr);
  return pDVar2;
}

Assistant:

void *createcell68k(unsigned int type) {
  struct dtd *dtd68k;
  DLword *ptr, *lastptr;
  LispPTR newcell;
#ifdef DTDDEBUG
  if (type == TYPE_LISTP) error("createcell : Can't create Listp cell with CREATECELL");
  if (type == TYPE_STREAM) stab();

  check_dtd_chain(type);

#endif

  dtd68k = (struct dtd *)GetDTD(type);

  if (dtd68k->dtd_size == 0) error("createcell : Attempt to create a cell not declared yet");

retry:
  if ((newcell = (dtd68k->dtd_free & POINTERMASK)) != NIL) {
#ifdef DTDDEBUG
    if (type != GetTypeNumber(newcell)) error("createcell : BAD cell in dtdfree");
    if (newcell > POINTERMASK) error("createcell : BAD Lisp address");
#endif

    ptr = NativeAligned2FromLAddr(newcell);

    if (917505 == *(LispPTR *)ptr) error("N_OP_createcell E0001 error");

    /* replace dtd_free with newcell's top DLword (it may keep next chain)*/
    dtd68k->dtd_free = (*((LispPTR *)ptr)) & POINTERMASK;
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");

#ifdef DTDDEBUG
    if ((dtd68k->dtd_free != 0) && (type != GetTypeNumber(dtd68k->dtd_free)))
      error("createcell : BAD cell in next dtdfree");
    check_dtd_chain(type);

#endif

    dtd68k->dtd_oldcnt++;

    /* clear 0  */
    for (lastptr = ptr + dtd68k->dtd_size; ptr != lastptr; ptr++) { GETWORD(ptr) = 0; }

    /*	IncAllocCnt(1); */
    GCLOOKUP(newcell, DELREF);

#ifdef DTDDEBUG
    check_dtd_chain(type);
#endif

    return (NativeAligned2FromLAddr(newcell)); /* XXX: is it really only aligned(2)? */

  } else {
    dtd68k->dtd_free = initmdspage(alloc_mdspage(dtd68k->dtd_typeentry), dtd68k->dtd_size, NIL);
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");

#ifdef DTDDEBUG
    check_dtd_chain(type);
#endif

    goto retry;
  }

}